

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltl_parser.c
# Opt level: O0

ltlNode * parseFormulaCreateAST(char *inputFormula)

{
  ltlNode *plVar1;
  ltlNode *temp;
  char *inputFormula_local;
  
  plVar1 = readLtlFormula(inputFormula);
  resetGlobalVar();
  return plVar1;
}

Assistant:

ltlNode *parseFormulaCreateAST( char *inputFormula )
{
	ltlNode *temp;

	temp = readLtlFormula( inputFormula );
	//if( temp == NULL )
	//	printf("\nAST creation failed for formula %s", inputFormula );
	resetGlobalVar();
	return temp;
}